

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

void test_utf8_char_print(char *c)

{
  uchar *d;
  char *c_local;
  
  printf("[0x%02X,0x%02X,0x%02X,0x%02X]",(ulong)(byte)*c,(ulong)(byte)c[1],(ulong)(byte)c[2],
         (ulong)(byte)c[3]);
  return;
}

Assistant:

static void test_utf8_char_print(test_utf8_char const c)
{
  unsigned char const* d = reinterpret_cast<unsigned char const*>(c);
#ifndef __clang_analyzer__ // somehow thinks arguments are not initialized
  printf("[0x%02X,0x%02X,0x%02X,0x%02X]", static_cast<int>(d[0]),
         static_cast<int>(d[1]), static_cast<int>(d[2]),
         static_cast<int>(d[3]));
#endif
}